

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdCreateExtkeyFromSeed(void *handle,char *seed_hex,int network_type,int key_type,char **extkey)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined4 in_ECX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  string key;
  HDWalletApi api;
  ExtKeyType output_key_type;
  NetType net_type;
  bool is_bitcoin;
  string *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe50;
  bool *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  allocator local_159;
  string local_158;
  ByteData local_138;
  string local_120 [39];
  HDWalletApi local_f9;
  undefined4 local_f8;
  ExtKeyType in_stack_ffffffffffffff28;
  NetType in_stack_ffffffffffffff2c;
  ByteData *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  undefined4 local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_28 = in_R8;
  local_20 = in_ECX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x680;
    local_50.funcname = "CfdCreateExtkeyFromSeed";
    cfd::core::logger::warn<>(&local_50,"extkey is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. extkey is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe50,error_code,in_stack_fffffffffffffe40);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x686;
    local_90.funcname = "CfdCreateExtkeyFromSeed";
    cfd::core::logger::warn<>(&local_90,"seed is null or empty.");
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. seed is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe50,error_code,in_stack_fffffffffffffe40);
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ConvertNetType(in_stack_fffffffffffffe94,in_stack_fffffffffffffe88);
  local_f8 = local_20;
  cfd::api::HDWalletApi::HDWalletApi(&local_f9);
  paVar4 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,local_18,paVar4);
  cfd::core::ByteData::ByteData(&local_138,&local_158);
  cfd::api::HDWalletApi::CreateExtkeyFromSeed_abi_cxx11_
            ((HDWalletApi *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  cfd::core::ByteData::~ByteData((ByteData *)0x5dc512);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  pcVar3 = cfd::capi::CreateString
                     ((string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  *local_28 = pcVar3;
  local_4 = 0;
  std::__cxx11::string::~string(local_120);
  return local_4;
}

Assistant:

int CfdCreateExtkeyFromSeed(
    void* handle, const char* seed_hex, int network_type, int key_type,
    char** extkey) {
  try {
    cfd::Initialize();
    if (extkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null.");
    }
    if (IsEmptyString(seed_hex)) {
      warn(CFD_LOG_SOURCE, "seed is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. seed is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    ExtKeyType output_key_type = static_cast<ExtKeyType>(key_type);
    HDWalletApi api;
    std::string key = api.CreateExtkeyFromSeed(
        ByteData(seed_hex), net_type, output_key_type);
    *extkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}